

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,String *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,String *params_8,
          ArrayPtr<const_char> *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *pos;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t elementCount;
  size_t local_c0;
  char *pcStack_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  size_t local_88;
  long local_80;
  undefined1 local_78 [16];
  size_t local_68;
  String local_60;
  StringTree *local_48;
  ArrayPtr<const_char> *local_40;
  StringTree *local_38;
  
  lVar6 = 0;
  lVar7 = 0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->text).content.disposer = (undefined1  [16])0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_c0 = this->size_;
  pcStack_b8 = (params->text).content.ptr;
  lVar5 = 0;
  local_b0 = params_1->size_ - 1;
  if (params_1->size_ == 0) {
    local_b0 = lVar5;
  }
  local_a8._0_8_ = (params_2->content).size_;
  local_a8._8_8_ = params_3->size_;
  local_98._0_8_ = params_4->size_;
  local_98._8_8_ = params_5->size_;
  local_88 = params_6->size_;
  local_80 = params_7->size_ - 1;
  if (params_7->size_ == 0) {
    local_80 = lVar5;
  }
  local_78._0_8_ = (params_8->content).size_;
  local_78._8_8_ = params_9->size_;
  local_68 = params_10->size_;
  do {
    lVar6 = lVar6 + (&local_c0)[lVar5];
    lVar7 = lVar7 + (&local_c0)[lVar5 + 1];
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xc);
  __return_storage_ptr__->size_ = lVar7 + lVar6;
  lVar5 = 0;
  local_c0 = 0;
  local_b0 = 0;
  local_80 = 0;
  lVar6 = 0;
  lVar7 = 0;
  do {
    lVar6 = lVar6 + (&local_c0)[lVar5];
    lVar7 = lVar7 + (&local_c0)[lVar5 + 1];
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xc);
  local_38 = this;
  heapString(&local_60,lVar7 + lVar6);
  (__return_storage_ptr__->text).content.ptr = local_60.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_60.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_60.content.disposer;
  local_c0 = 1;
  lVar5 = 0;
  pcStack_b8 = (char *)0x0;
  local_b0 = 1;
  lVar6 = 0;
  lVar7 = 0;
  local_a8 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = 0;
  local_80 = 1;
  local_78 = (undefined1  [16])0x0;
  local_68 = 0;
  do {
    lVar6 = lVar6 + (&local_c0)[lVar5];
    lVar7 = lVar7 + (&local_c0)[lVar5 + 1];
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xc);
  elementCount = lVar7 + lVar6;
  local_48 = params;
  local_40 = (ArrayPtr<const_char> *)params_2;
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,elementCount,elementCount,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_60.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_60.content.ptr = (char *)pBVar4;
  local_60.content.size_ = elementCount;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = elementCount;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_38,(ArrayPtr<const_char> *)local_48,
             (String *)params_1,local_40,params_3,params_4,params_5,params_6,(String *)params_7,
             (ArrayPtr<const_char> *)params_8,params_9,params_10);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}